

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int uncompress2mem(char *filename,FILE *diskfile,char **buffptr,size_t *buffsize,
                  _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  undefined4 local_d8;
  ulong uStack_d0;
  uInt outbuffsize;
  uLong iPage;
  uLong nPages;
  z_stream d_stream;
  char *filebuff;
  int len;
  int err;
  size_t *filesize_local;
  _func_void_ptr_void_ptr_size_t *mem_realloc_local;
  size_t *buffsize_local;
  char **buffptr_local;
  FILE *diskfile_local;
  char *filename_local;
  
  uVar2 = *buffsize / 0xffffffff;
  uStack_d0 = 0;
  if (uVar2 == 0) {
    local_d8 = (undefined4)*buffsize;
  }
  else {
    local_d8 = 0xffffffff;
  }
  if (*status < 1) {
    d_stream.reserved = (uLong)malloc(0x1c200);
    if ((void *)d_stream.reserved == (void *)0x0) {
      *status = 0x71;
      filename_local._4_4_ = 0x71;
    }
    else {
      d_stream.state = (internal_state *)0x0;
      d_stream.zalloc = (alloc_func)0x0;
      d_stream.zfree = (free_func)0x0;
      d_stream.total_in = (uLong)*buffptr;
      d_stream.next_out._0_4_ = local_d8;
      iVar1 = inflateInit2_(&nPages,0x1f,"1.2.11",0x70);
      if (iVar1 == 0) {
        do {
          sVar3 = fread((void *)d_stream.reserved,1,0x1c200,(FILE *)diskfile);
          iVar1 = ferror((FILE *)diskfile);
          if (iVar1 != 0) {
            inflateEnd(&nPages);
            free((void *)d_stream.reserved);
            *status = 0x19e;
            return 0x19e;
          }
          if ((int)sVar3 == 0) break;
          nPages = d_stream.reserved;
          d_stream.next_in._0_4_ = (int)sVar3;
          while (iVar1 = inflate(&nPages,0), iVar1 != 1) {
            if ((iVar1 != 0) && (iVar1 != -5)) {
              inflateEnd(&nPages);
              free((void *)d_stream.reserved);
              *status = 0x19e;
              return 0x19e;
            }
            if ((int)d_stream.next_in == 0) break;
            if (uStack_d0 < uVar2) {
              uStack_d0 = uStack_d0 + 1;
              d_stream.total_in = (uLong)(*buffptr + uStack_d0 * 0xffffffff);
              if (uStack_d0 < uVar2) {
                d_stream.next_out._0_4_ = 0xffffffff;
              }
              else {
                d_stream.next_out._0_4_ = (undefined4)(*buffsize % 0xffffffff);
              }
            }
            else {
              if (mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) {
                inflateEnd(&nPages);
                free((void *)d_stream.reserved);
                *status = 0x19e;
                return 0x19e;
              }
              pcVar4 = (char *)(*mem_realloc)(*buffptr,*buffsize + 0x7080);
              *buffptr = pcVar4;
              if (*buffptr == (char *)0x0) {
                inflateEnd(&nPages);
                free((void *)d_stream.reserved);
                *status = 0x19e;
                return 0x19e;
              }
              d_stream.next_out._0_4_ = 0x7080;
              d_stream.total_in = (uLong)(*buffptr + *buffsize);
              *buffsize = *buffsize + 0x7080;
            }
          }
          iVar1 = feof((FILE *)diskfile);
        } while (iVar1 == 0);
        *filesize = d_stream._32_8_;
        free((void *)d_stream.reserved);
        iVar1 = inflateEnd(&nPages);
        if (iVar1 == 0) {
          filename_local._4_4_ = *status;
        }
        else {
          *status = 0x19e;
          filename_local._4_4_ = 0x19e;
        }
      }
      else {
        *status = 0x19e;
        filename_local._4_4_ = 0x19e;
      }
    }
  }
  else {
    filename_local._4_4_ = *status;
  }
  return filename_local._4_4_;
}

Assistant:

int uncompress2mem(char *filename,  /* name of input file                 */
             FILE *diskfile,     /* I - file pointer                        */
             char **buffptr,   /* IO - memory pointer                     */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the disk file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err, len;
    char *filebuff;
    z_stream d_stream;   /* decompression stream */
    /* Input args buffptr and buffsize may refer to a block of memory
        larger than the 2^32 4 byte limit.  If so, must be broken
        up into "pages" when assigned to d_stream.  
        (d_stream.avail_out is a uInt type, which might be smaller
        than buffsize's size_t type.)
    */
    const uLong nPages = (uLong)(*buffsize)/(uLong)UINT_MAX;
    uLong iPage=0;
    uInt outbuffsize = (nPages > 0) ? UINT_MAX : (uInt)(*buffsize);
    

    if (*status > 0) 
        return(*status); 

    /* Allocate memory to hold compressed bytes read from the file. */
    filebuff = (char*)malloc(GZBUFSIZE);
    if (!filebuff) return(*status = 113); /* memory error */

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;
    d_stream.next_out = (unsigned char*) *buffptr;
    d_stream.avail_out = outbuffsize;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */

    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    /* loop through the file, reading a buffer and uncompressing it */
    for (;;)
    {
        len = fread(filebuff, 1, GZBUFSIZE, diskfile);
	if (ferror(diskfile)) {
              inflateEnd(&d_stream);
              free(filebuff);
              return(*status = 414);
	}

        if (len == 0) break;  /* no more data */

        d_stream.next_in = (unsigned char*)filebuff;
        d_stream.avail_in = len;

        for (;;) {
            /* uncompress as much of the input as will fit in the output */
            err = inflate(&d_stream, Z_NO_FLUSH);

            if (err == Z_STREAM_END ) { /* We reached the end of the input */
	        break; 
            } else if (err == Z_OK || err == Z_BUF_ERROR) { 
	        /* Z_BUF_ERROR means need more input data to make progress */
                if (!d_stream.avail_in) break; /* need more input */
		
                /* need more space in output buffer */
                /* First check if more memory is available above the
                    4Gb limit in the originally input buffptr array */
                if (iPage < nPages)
                {
                   ++iPage;
                   d_stream.next_out = (unsigned char*)(*buffptr + iPage*(uLong)UINT_MAX);
                   if (iPage < nPages)
                      d_stream.avail_out = UINT_MAX;
                   else
                      d_stream.avail_out = (uInt)((uLong)(*buffsize) % (uLong)UINT_MAX);
                }
                else if (mem_realloc) {   
                    *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                    if (*buffptr == NULL){
                        inflateEnd(&d_stream);
                        free(filebuff);
                        return(*status = 414);  /* memory allocation failed */
                    }

                    d_stream.avail_out = BUFFINCR;
                    d_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                    *buffsize = *buffsize + BUFFINCR;
                } else  { /* error: no realloc function available */
                    inflateEnd(&d_stream);
                    free(filebuff);
                    return(*status = 414);
                }
            } else {  /* some other error */
                inflateEnd(&d_stream);
                free(filebuff);
                return(*status = 414);
            }
        }
	
	if (feof(diskfile))  break;
/*     
        These settings for next_out and avail_out appear to be redundant,
        as the inflate() function should already be re-setting these.
        For case where *buffsize < 4Gb this did not matter, but for
        > 4Gb it would produce the wrong value in the avail_out assignment.
        (C. Gordon Jul 2016)
        d_stream.next_out = (unsigned char*) (*buffptr + d_stream.total_out);
        d_stream.avail_out = *buffsize - d_stream.total_out;
*/    }

    /* Set the output file size to be the total output data */
    *filesize = d_stream.total_out;
    
    free(filebuff); /* free temporary output data buffer */
    
    err = inflateEnd(&d_stream); /* End the decompression */
    if (err != Z_OK) return(*status = 414);
  
    return(*status);
}